

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

uint64 crnlib::dxt_fast::determine_error
                 (uint n,color_quad_u8 *block,uint min16,uint max16,uint64 early_out_error)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int i;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  color_quad_u8 color [4];
  int stops [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_58;
  byte local_54;
  byte local_53;
  byte local_52;
  int local_48 [4];
  uint64 local_38;
  
  local_38 = early_out_error;
  eval_colors((color_quad_u8 *)&local_58.field_0,min16,max16);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_48[lVar4] =
         (uint)*(byte *)((long)local_48 + lVar4 * 4 + -0xe) *
         ((uint)local_58.field_0.b - (uint)local_52) +
         (uint)*(byte *)((long)local_48 + lVar4 * 4 + -0xf) *
         ((uint)local_58.field_0.g - (uint)local_53) +
         (uint)*(byte *)(local_48 + lVar4 + -4) * ((uint)local_58.field_0.r - (uint)local_54);
  }
  uVar8 = 0;
  uVar5 = 0;
  do {
    if (n == uVar8) {
      return uVar5;
    }
    if (min16 == max16) {
      uVar6 = (uint)block[uVar8].field_0.field_0.r;
      uVar9 = (uint)block[uVar8].field_0.field_0.g;
      uVar11 = (uint)block[uVar8].field_0.field_0.b;
      uVar7 = 0;
    }
    else {
      bVar1 = block[uVar8].field_0.field_0.r;
      uVar6 = (uint)bVar1;
      bVar2 = block[uVar8].field_0.field_0.g;
      uVar9 = (uint)bVar2;
      bVar3 = block[uVar8].field_0.field_0.b;
      uVar11 = (uint)bVar3;
      iVar10 = ((uint)local_58.field_0.b - (uint)local_52) * (uint)bVar3 +
               ((uint)local_58.field_0.g - (uint)local_53) * (uint)bVar2 +
               ((uint)local_58.field_0.r - (uint)local_54) * (uint)bVar1;
      uVar7 = (ulong)((uint)(iVar10 < local_48[2] + local_48[0] >> 1) * 2);
      if (iVar10 < local_48[3] + local_48[2] >> 1) {
        uVar7 = (ulong)(local_48[1] + local_48[3] >> 1 <= iVar10) * 2 + 1;
      }
    }
    iVar10 = uVar9 - *(byte *)((long)local_48 + uVar7 * 4 + -0xf);
    iVar12 = uVar11 - *(byte *)((long)local_48 + uVar7 * 4 + -0xe);
    uVar5 = uVar5 + (uVar6 - *(byte *)(local_48 + (uVar7 - 4))) *
                    (uVar6 - *(byte *)(local_48 + (uVar7 - 4))) +
            (ulong)(uint)(iVar12 * iVar12) + (ulong)(uint)(iVar10 * iVar10);
    uVar8 = uVar8 + 1;
  } while (uVar5 < local_38);
  return uVar5;
}

Assistant:

static uint64 determine_error(uint n, const color_quad_u8* block, uint min16, uint max16, uint64 early_out_error)
        {
            color_quad_u8 color[4];

            eval_colors(color, min16, max16);

            int dirr = color[0].r - color[1].r;
            int dirg = color[0].g - color[1].g;
            int dirb = color[0].b - color[1].b;

            int stops[4];
            for (int i = 0; i < 4; i++)
            {
                stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;
            }

            // 0 2 3 1
            int c0Point = stops[1] + stops[3];
            int halfPoint = stops[3] + stops[2];
            int c3Point = stops[2] + stops[0];

            c0Point >>= 1;
            halfPoint >>= 1;
            c3Point >>= 1;

            uint64 total_error = 0;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& a = block[i];

                uint s = 0;
                if (min16 != max16)
                {
                    int dot = a.r * dirr + a.g * dirg + a.b * dirb;

                    if (dot < halfPoint)
                    {
                        s = (dot < c0Point) ? 1 : 3;
                    }
                    else
                    {
                        s = (dot < c3Point) ? 2 : 0;
                    }
                }

                const color_quad_u8& b = color[s];

                int e = a[0] - b[0];
                total_error += e * e;

                e = a[1] - b[1];
                total_error += e * e;

                e = a[2] - b[2];
                total_error += e * e;

                if (total_error >= early_out_error)
                {
                    break;
                }
            }

            return total_error;
        }